

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edata_cache.c
# Opt level: O2

edata_t * duckdb_je_edata_cache_fast_get(tsdn_t *tsdn,edata_cache_fast_t *ecs)

{
  atomic_zu_t *paVar1;
  edata_t *peVar2;
  edata_cache_t *peVar3;
  edata_t *peVar4;
  int iVar5;
  bool bVar6;
  
  if (ecs->disabled == true) {
    peVar4 = duckdb_je_edata_cache_get(tsdn,ecs->fallback);
    return peVar4;
  }
  peVar4 = (ecs->list).head.qlh_first;
  if (peVar4 == (edata_t *)0x0) {
    malloc_mutex_lock(tsdn,&ecs->fallback->mtx);
    iVar5 = 4;
    while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
      peVar4 = duckdb_je_edata_avail_remove_first(&ecs->fallback->avail);
      if (peVar4 == (edata_t *)0x0) break;
      (peVar4->field_6).ql_link_inactive.qre_next = peVar4;
      (peVar4->field_6).ql_link_inactive.qre_prev = peVar4;
      peVar2 = (ecs->list).head.qlh_first;
      if (peVar2 != (edata_t *)0x0) {
        (peVar4->field_6).ql_link_inactive.qre_next = (peVar2->field_6).ql_link_inactive.qre_prev;
        (((ecs->list).head.qlh_first)->field_6).ql_link_inactive.qre_prev = peVar4;
        (peVar4->field_6).ql_link_inactive.qre_prev =
             (((peVar4->field_6).ql_link_inactive.qre_prev)->field_6).ql_link_inactive.qre_next;
        peVar2 = (ecs->list).head.qlh_first;
        (((peVar2->field_6).ql_link_inactive.qre_prev)->field_6).ql_link_inactive.qre_next = peVar2;
        (((peVar4->field_6).ql_link_inactive.qre_prev)->field_6).ql_link_inactive.qre_next = peVar4;
        peVar4 = (peVar4->field_6).ql_link_inactive.qre_next;
      }
      (ecs->list).head.qlh_first = peVar4;
      paVar1 = &ecs->fallback->count;
      paVar1->repr = paVar1->repr - 1;
    }
    peVar3 = ecs->fallback;
    (peVar3->mtx).field_0.field_0.locked.repr = false;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&(peVar3->mtx).field_0 + 0x48));
    peVar4 = (ecs->list).head.qlh_first;
    if (peVar4 == (edata_t *)0x0) {
      peVar4 = duckdb_je_base_alloc_edata(tsdn,ecs->fallback->base);
      return peVar4;
    }
  }
  edata_list_inactive_remove(&ecs->list,peVar4);
  return peVar4;
}

Assistant:

edata_t *
edata_cache_fast_get(tsdn_t *tsdn, edata_cache_fast_t *ecs) {
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_EDATA_CACHE, 0);

	if (ecs->disabled) {
		assert(edata_list_inactive_first(&ecs->list) == NULL);
		return edata_cache_get(tsdn, ecs->fallback);
	}

	edata_t *edata = edata_list_inactive_first(&ecs->list);
	if (edata != NULL) {
		edata_list_inactive_remove(&ecs->list, edata);
		return edata;
	}
	/* Slow path; requires synchronization. */
	edata_cache_fast_try_fill_from_fallback(tsdn, ecs);
	edata = edata_list_inactive_first(&ecs->list);
	if (edata != NULL) {
		edata_list_inactive_remove(&ecs->list, edata);
	} else {
		/*
		 * Slowest path (fallback was also empty); allocate something
		 * new.
		 */
		edata = base_alloc_edata(tsdn, ecs->fallback->base);
	}
	return edata;
}